

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O3

Abc_Cex_t * Saig_RefManRunSat(Saig_RefMan_t *p,int fNewOrder)

{
  uint uVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  void **ppvVar4;
  lit *begin;
  int iVar5;
  int iVar6;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vVar2PiId;
  Vec_Int_t *p_00;
  int *piVar7;
  Vec_Vec_t *pVVar8;
  void *pvVar9;
  Abc_Cex_t *pAVar10;
  int iVar11;
  Vec_Ptr_t *pVVar12;
  char *__s;
  long lVar13;
  size_t sVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  size_t __nmemb;
  timespec ts;
  int *local_60;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  if (p->pFrames->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p->pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0x203,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
  }
  pCnf = Cnf_DeriveSimple(p->pFrames,0);
  iVar5 = Saig_RefManSetPhases(p,(Abc_Cex_t *)0x0,0);
  if (iVar5 != 0) {
    puts("Constructed frames are incorrect.");
LAB_00615a07:
    Cnf_DataFree(pCnf);
    return (Abc_Cex_t *)0x0;
  }
  Cnf_DataTranformPolarity(pCnf,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf,1,0);
  if (s == (sat_solver *)0x0) goto LAB_00615a07;
  if ((0 < p->nInputs) &&
     (iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0), iVar5 == -1)) {
    puts("The problem is trivially UNSAT. The CEX is real.");
    pAVar10 = Abc_CexDup(p->pCex,p->pCex->nRegs);
    memset(pAVar10 + 1,0,
           (long)(int)(((pAVar10->nBits >> 5) + 1) - (uint)((pAVar10->nBits & 0x1fU) == 0)) << 2);
    return pAVar10;
  }
  iVar5 = pCnf->nVars;
  vVar2PiId = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  vVar2PiId->nCap = iVar6;
  if (iVar6 == 0) {
    vVar2PiId->pArray = (int *)0x0;
    vVar2PiId->nSize = iVar5;
LAB_00615aec:
    local_60 = (int *)0x0;
  }
  else {
    local_60 = (int *)malloc((long)iVar6 << 2);
    vVar2PiId->pArray = local_60;
    vVar2PiId->nSize = iVar5;
    if (local_60 == (int *)0x0) goto LAB_00615aec;
    memset(local_60,0xff,(long)iVar5 << 2);
  }
  pAVar3 = p->pFrames;
  iVar6 = pAVar3->nObjs[2];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar11 = 0x10;
  if (0xe < iVar6 - 1U) {
    iVar11 = iVar6;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar11;
  if (iVar11 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc((long)iVar11 << 2);
  }
  p_00->pArray = piVar7;
  pVVar12 = pAVar3->vCis;
  if (0 < pVVar12->nSize) {
    piVar7 = pCnf->pVarNums;
    lVar13 = 0;
    do {
      pvVar9 = pVVar12->pArray[lVar13];
      Vec_IntPush(p_00,piVar7[*(int *)((long)pvVar9 + 0x24)] * 2 + 1);
      piVar7 = pCnf->pVarNums;
      iVar6 = piVar7[*(int *)((long)pvVar9 + 0x24)];
      if (((long)iVar6 < 0) || (iVar5 <= iVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      local_60[iVar6] = (int)lVar13;
      lVar13 = lVar13 + 1;
      pVVar12 = p->pFrames->vCis;
    } while (lVar13 < pVVar12->nSize);
  }
  if (fNewOrder != 0) {
    pVVar8 = Saig_RefManOrderLiterals(p,vVar2PiId,p_00);
    uVar1 = pVVar8->nSize;
    __nmemb = (size_t)(int)uVar1;
    ppvVar4 = pVVar8->pArray;
    qsort(ppvVar4,__nmemb,8,Vec_VecSortCompare2);
    p_00->nSize = 0;
    if (0 < (long)__nmemb) {
      sVar14 = 0;
      do {
        pvVar9 = ppvVar4[sVar14];
        if (0 < *(int *)((long)pvVar9 + 4)) {
          lVar13 = 0;
          do {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar9 + 8) + lVar13 * 4));
            lVar13 = lVar13 + 1;
            pvVar9 = ppvVar4[sVar14];
          } while (lVar13 < *(int *)((long)pvVar9 + 4));
        }
        sVar14 = sVar14 + 1;
      } while (sVar14 != __nmemb);
      if (0 < (int)uVar1) {
        sVar14 = 0;
        do {
          printf("%d ",(ulong)*(uint *)((long)ppvVar4[sVar14] + 4));
          sVar14 = sVar14 + 1;
        } while (__nmemb != sVar14);
      }
    }
    putchar(10);
    if (p->fVerbose != 0) {
      printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(p->pAig->nTruePis - p->nInputs),
             (ulong)uVar1);
    }
  }
  clock_gettime(3,&local_40);
  begin = p_00->pArray;
  uVar1 = p_00->nSize;
  iVar5 = sat_solver_solve(s,begin,begin + (int)uVar1,1000000,0,0,0);
  if (iVar5 != -1) {
    if (iVar5 == 1) {
      __s = "Internal Error!!! The resulting problem is SAT.";
    }
    else {
      __s = "Internal Error!!! SAT solver timed out.";
    }
    puts(__s);
    Cnf_DataFree(pCnf);
    sat_solver_delete(s);
    if (begin != (lit *)0x0) {
      free(begin);
    }
    free(p_00);
    if (local_60 != (int *)0x0) {
      free(local_60);
    }
    free(vVar2PiId);
    return (Abc_Cex_t *)0x0;
  }
  uVar2 = (s->conf_final).size;
  if ((int)uVar2 < 1) {
    __assert_fail("nCoreLits > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSat.c"
                  ,0x25d,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
  }
  piVar7 = (s->conf_final).ptr;
  if (p->fVerbose != 0) {
    printf("AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n",(ulong)uVar2,
           (ulong)uVar1,(ulong)(uint)(s->stats).conflicts);
  }
  p_00->nSize = 0;
  uVar16 = 0;
  do {
    Vec_IntPush(p_00,piVar7[uVar16]);
    uVar16 = uVar16 + 1;
  } while (uVar2 != uVar16);
  pVVar8 = Saig_RefManOrderLiterals(p,vVar2PiId,p_00);
  p_00->nSize = 0;
  uVar1 = pVVar8->nSize;
  lVar13 = (long)(int)uVar1;
  if (0 < lVar13) {
    ppvVar4 = pVVar8->pArray;
    lVar15 = 0;
    do {
      pvVar9 = ppvVar4[lVar15];
      if (0 < *(int *)((long)pvVar9 + 4)) {
        lVar17 = 0;
        do {
          Vec_IntPush(p_00,*(int *)(*(long *)((long)pvVar9 + 8) + lVar17 * 4));
          lVar17 = lVar17 + 1;
          pvVar9 = ppvVar4[lVar15];
        } while (lVar17 < *(int *)((long)pvVar9 + 4));
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != lVar13);
  }
  if (p->fVerbose != 0) {
    printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(p->pAig->nTruePis - p->nInputs),
           (ulong)uVar1);
  }
  pAVar10 = Saig_RefManCreateCex(p,vVar2PiId,p_00);
  Cnf_DataFree(pCnf);
  sat_solver_delete(s);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (local_60 != (int *)0x0) {
    free(local_60);
  }
  free(vVar2PiId);
  ppvVar4 = pVVar8->pArray;
  if ((int)uVar1 < 1) {
    if (ppvVar4 == (void **)0x0) goto LAB_00615eef;
  }
  else {
    lVar15 = 0;
    do {
      pvVar9 = ppvVar4[lVar15];
      if (pvVar9 != (void *)0x0) {
        if (*(void **)((long)pvVar9 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar9 + 8));
        }
        free(pvVar9);
      }
      lVar15 = lVar15 + 1;
    } while (lVar13 != lVar15);
  }
  free(ppvVar4);
LAB_00615eef:
  free(pVVar8);
  iVar5 = Saig_RefManSetPhases(p,pAVar10,0);
  if (iVar5 != 0) {
    puts("Reduced CEX verification has failed.");
  }
  iVar5 = Saig_RefManSetPhases(p,pAVar10,1);
  if (iVar5 != 0) {
    puts("Reduced CEX verification has failed.");
    return pAVar10;
  }
  return pAVar10;
}

Assistant:

Abc_Cex_t * Saig_RefManRunSat( Saig_RefMan_t * p, int fNewOrder )
{
    int nConfLimit = 1000000;
    Abc_Cex_t * pCare;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits = NULL;
    Vec_Int_t * vAssumps, * vVar2PiId;
    int i, k, Entry, RetValue;//, f = 0, Counter = 0;
    int nCoreLits, * pCoreLits;
    abctime clk = Abc_Clock();
    // create CNF
    assert( Aig_ManRegNum(p->pFrames) == 0 );
//    pCnf = Cnf_Derive( p->pFrames, 0 ); // too slow
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    RetValue = Saig_RefManSetPhases( p, NULL, 0 );
    if ( RetValue )
    {
        printf( "Constructed frames are incorrect.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    Cnf_DataTranformPolarity( pCnf, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
//Abc_PrintTime( 1, "Preparing", Abc_Clock() - clk );
    // look for a true counter-example
    if ( p->nInputs > 0 )
    {
        RetValue = sat_solver_solve( pSat, NULL, NULL, 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            printf( "The problem is trivially UNSAT. The CEX is real.\n" );
            // create counter-example
            pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
            memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
            return pCare;
        }
        // the problem is SAT - it is expected
    }
    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
//        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }

    // reverse the order of assumptions
//    if ( fNewOrder )
//    Vec_IntReverseOrder( vAssumps );

    if ( fNewOrder )
    {
        // create literals
        vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
        // sort literals
        Vec_VecSort( vLits, 1 );
        // save literals
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            Vec_IntPush( vAssumps, Entry );

        for ( i = 0; i < Vec_VecSize(vLits); i++ )
            printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
        printf( "\n" );

        if ( p->fVerbose )
            printf( "Total PIs = %d. Essential PIs = %d.\n", 
                Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
    }

    // solve
clk = Abc_Clock();
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//Abc_PrintTime( 1, "Solving", Abc_Clock() - clk );
    if ( RetValue != l_False )
    {
        if ( RetValue == l_True )
            printf( "Internal Error!!! The resulting problem is SAT.\n" );
        else
            printf( "Internal Error!!! SAT solver timed out.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Vec_IntFree( vAssumps );
        Vec_IntFree( vVar2PiId );
        return NULL;
    }
    assert( RetValue == l_False ); // UNSAT

    // get relevant SAT literals
    nCoreLits = sat_solver_final( pSat, &pCoreLits );
    assert( nCoreLits > 0 );
    if ( p->fVerbose )
    printf( "AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n", 
        nCoreLits, Vec_IntSize(vAssumps), (int)pSat->stats.conflicts );

    // save literals
    Vec_IntClear( vAssumps );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( vAssumps, pCoreLits[i] );


    // create literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    // sort literals
//    Vec_VecSort( vLits, 0 );
    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

//    for ( i = 0; i < Vec_VecSize(vLits); i++ )
//        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
//    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
/*
    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );

    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );
*/
    // create counter-example
    pCare = Saig_RefManCreateCex( p, vVar2PiId, vAssumps );

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    // verify counter-example
    RetValue = Saig_RefManSetPhases( p, pCare, 0 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    RetValue = Saig_RefManSetPhases( p, pCare, 1 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    return pCare;
}